

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcInstPrinter.c
# Opt level: O0

void printOperand(MCInst *MI,SStream *O,m680x_info *info,cs_m680x_op *op)

{
  uint32_t uVar1;
  cs_struct *in_RCX;
  SStream *OS;
  uint uVar2;
  long in_RDX;
  SStream *in_RSI;
  long in_RDI;
  cs_m680x_op *in_stack_ffffffffffffffc8;
  m680x_info *in_stack_ffffffffffffffd0;
  
  OS = (SStream *)(ulong)(in_RCX->arch - CS_ARCH_ARM64);
  switch(OS) {
  case (SStream *)0x0:
    printRegName(in_RCX,OS,(uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    break;
  case (SStream *)0x1:
    if (*(int *)(*(long *)(in_RDI + 800) + 100) == 0) {
      SStream_concat(in_RSI,"#%d",(ulong)(uint)in_RCX->mode);
    }
    else {
      uVar1 = get_unsigned(in_RCX->mode,(uint)*(byte *)((long)&in_RCX->printer_info + 4));
      SStream_concat(in_RSI,"#%u",(ulong)uVar1);
    }
    break;
  case (SStream *)0x2:
    if (((ulong)in_RCX->printer_info & 0x10000) != 0) {
      SStream_concat(in_RSI,"[");
    }
    if (*(int *)&in_RCX->printer == 0) {
      if (*(char *)&in_RCX->printer_info == '\0') {
        if ((*(char *)((long)&in_RCX->printer_info + 1) != '\0') && (*(int *)(in_RDX + 0x10) == 9))
        {
          uVar2 = (uint)*(char *)((long)&in_RCX->printer_info + 1);
          if ((int)uVar2 < 1) {
            uVar2 = -uVar2;
          }
          SStream_concat(in_RSI,"%d",(ulong)uVar2);
        }
      }
      else if (in_RCX->mode == 0x13) {
        SStream_concat(in_RSI,"$%04X",(ulong)*(ushort *)((long)&in_RCX->printer + 6));
      }
      else {
        SStream_concat(in_RSI,"%d",(ulong)(uint)(int)*(short *)((long)&in_RCX->printer + 4));
      }
    }
    else {
      printRegName(in_RCX,OS,(uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    }
    if (((ulong)in_RCX->printer_info & 0x20000) == 0) {
      SStream_concat(in_RSI,",");
    }
    printIncDec(SUB81((ulong)in_RCX >> 0x38,0),OS,in_stack_ffffffffffffffd0,
                in_stack_ffffffffffffffc8);
    printRegName(in_RCX,OS,(uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    if ((in_RCX->mode == 0x13) && (*(char *)&in_RCX->printer_info != '\0')) {
      SStream_concat(in_RSI,"R");
    }
    printIncDec(SUB81((ulong)in_RCX >> 0x38,0),OS,in_stack_ffffffffffffffd0,
                in_stack_ffffffffffffffc8);
    if (((ulong)in_RCX->printer_info & 0x10000) != 0) {
      SStream_concat(in_RSI,"]");
    }
    break;
  case (SStream *)0x3:
    if ((in_RCX->mode & 0x10000) == CS_MODE_ARM) {
      if ((ushort)(short)in_RCX->mode < CS_MODE_M680X_6811) {
        SStream_concat(in_RSI,">$%04X",(ulong)(ushort)(short)in_RCX->mode);
      }
      else {
        SStream_concat(in_RSI,"$%04X",(ulong)(ushort)(short)in_RCX->mode);
      }
    }
    else {
      SStream_concat(in_RSI,"[$%04X]",(ulong)(ushort)(short)in_RCX->mode);
    }
    break;
  case (SStream *)0x4:
    SStream_concat(in_RSI,"$%02X",(ulong)(byte)(char)in_RCX->mode);
    break;
  case (SStream *)0x5:
    SStream_concat(in_RSI,"$%04X",(ulong)(ushort)(short)in_RCX->mode);
    break;
  case (SStream *)0x6:
    SStream_concat(in_RSI,"%u",(ulong)(byte)(char)in_RCX->mode);
    break;
  default:
    SStream_concat(in_RSI,"<invalid_operand>");
  }
  return;
}

Assistant:

static void printOperand(MCInst *MI, int opNum, SStream *O)
{
	int64_t Imm;
	unsigned reg;
	MCOperand *MO = MCInst_getOperand(MI, opNum);

	if (MCOperand_isReg(MO)) {
		reg = MCOperand_getReg(MO);
		printRegName(O, reg);
		reg = Sparc_map_register(reg);

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				if (MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.base)
					MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.index = (uint8_t)reg;
				else
					MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.base = (uint8_t)reg;
			} else {
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].type = SPARC_OP_REG;
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].reg = reg;
				MI->flat_insn->detail->sparc.op_count++;
			}
		}

		return;
	}

	if (MCOperand_isImm(MO)) {
		Imm = (int)MCOperand_getImm(MO);

		// Conditional branches displacements needs to be signextended to be
		// able to jump backwards.
		//
		// Displacements are measured as the number of instructions forward or
		// backward, so they need to be multiplied by 4
		switch (MI->Opcode) {
			case SP_CALL:
				// Imm = SignExtend32(Imm, 30);
				Imm += MI->address;
				break;

			// Branch on integer condition with prediction (BPcc)
			// Branch on floating point condition with prediction (FBPfcc)
			case SP_BPICC:
			case SP_BPICCA:
			case SP_BPICCANT:
			case SP_BPICCNT:
			case SP_BPXCC:
			case SP_BPXCCA:
			case SP_BPXCCANT:
			case SP_BPXCCNT:
			case SP_BPFCC:
			case SP_BPFCCA:
			case SP_BPFCCANT:
			case SP_BPFCCNT:
				Imm = SignExtend32(Imm, 19);
				Imm = MI->address + Imm * 4;
				break;

			// Branch on integer condition (Bicc)
			// Branch on floating point condition (FBfcc)
			case SP_BA:
			case SP_BCOND:
			case SP_BCONDA:
			case SP_FBCOND:
			case SP_FBCONDA:
				Imm = SignExtend32(Imm, 22);
				Imm = MI->address + Imm * 4;
				break;

			// Branch on integer register with prediction (BPr)
			case SP_BPGEZapn:
			case SP_BPGEZapt:
			case SP_BPGEZnapn:
			case SP_BPGEZnapt:
			case SP_BPGZapn:
			case SP_BPGZapt:
			case SP_BPGZnapn:
			case SP_BPGZnapt:
			case SP_BPLEZapn:
			case SP_BPLEZapt:
			case SP_BPLEZnapn:
			case SP_BPLEZnapt:
			case SP_BPLZapn:
			case SP_BPLZapt:
			case SP_BPLZnapn:
			case SP_BPLZnapt:
			case SP_BPNZapn:
			case SP_BPNZapt:
			case SP_BPNZnapn:
			case SP_BPNZnapt:
			case SP_BPZapn:
			case SP_BPZapt:
			case SP_BPZnapn:
			case SP_BPZnapt:
				Imm = SignExtend32(Imm, 16);
				Imm = MI->address + Imm * 4;
				break;
		}
		
		printInt64(O, Imm);

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.disp = Imm;
			} else {
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].type = SPARC_OP_IMM;
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].imm = Imm;
				MI->flat_insn->detail->sparc.op_count++;
			}
		}
	}

	return;
}